

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall
ft::list<std::__cxx11::string,ft::allocator<std::__cxx11::string>>::
mergeSort<ft::less<std::__cxx11::string>>
          (list<std::__cxx11::string,ft::allocator<std::__cxx11::string>> *this,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *first)

{
  undefined1 auStack_48 [8];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  second;
  
  if (1 < first->m_size) {
    auStack_48 = (undefined1  [8])0x0;
    second.m_head = (node *)0x0;
    second.m_tail = (node *)0x0;
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::listInit((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)auStack_48);
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::split((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this,first,
            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_48);
    mergeSort<ft::less<std::__cxx11::string>>(this,first);
    mergeSort<ft::less<std::__cxx11::string>>(this,auStack_48);
    merge<ft::less<std::__cxx11::string>>
              ((list<std::__cxx11::string,ft::allocator<std::__cxx11::string>> *)first,auStack_48);
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~list((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ft::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_48);
  }
  return;
}

Assistant:

void mergeSort(list & first, Compare comp) {
		if (first.size() > 1) {
			list	second;
			this->split(first, second);

			this->mergeSort(first, comp);
			this->mergeSort(second, comp);

			first.merge(second, comp);
		}
	}